

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateEnumValueDocComment
               (Printer *printer,EnumValueDescriptor *value)

{
  bool bVar1;
  string local_c0;
  undefined1 local_a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer pbStack_48;
  pointer local_40;
  string local_38;
  
  io::Printer::Print(printer,"/**\n");
  local_a0._16_8_ = &local_80;
  local_a0._24_8_ = 0;
  local_80._M_local_buf[0] = '\0';
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50 = (pointer)0x0;
  pbStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  bVar1 = EnumValueDescriptor::GetSourceLocation(value,(SourceLocation *)local_a0);
  if (bVar1) {
    GenerateDocCommentBodyForLocation(printer,(SourceLocation *)local_a0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_a0);
  EnumValueDescriptor::DebugString_abi_cxx11_(&local_38,value);
  FirstLineOf(&local_c0,&local_38);
  EscapePhpdoc((string *)local_a0,&local_c0);
  io::Printer::Print(printer," * <code>^def^</code>\n */\n","def",(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void GenerateEnumValueDocComment(io::Printer* printer,
                                 const EnumValueDescriptor* value) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, value);
  printer->Print(
    " * <code>^def^</code>\n"
    " */\n",
    "def", EscapePhpdoc(FirstLineOf(value->DebugString())));
}